

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

ecs_entity_t
ecs_new_trigger(ecs_world_t *world,ecs_entity_t e,char *name,ecs_entity_t kind,char *component_name,
               ecs_iter_action_t action)

{
  long *plVar1;
  EcsTrigger *trigger;
  ecs_entity_t eStack_48;
  _Bool added;
  ecs_entity_t result;
  ecs_entity_t component;
  ecs_iter_action_t action_local;
  char *component_name_local;
  ecs_entity_t kind_local;
  char *name_local;
  ecs_entity_t e_local;
  ecs_world_t *world_local;
  
  component = (ecs_entity_t)action;
  action_local = (ecs_iter_action_t)component_name;
  component_name_local = (char *)kind;
  kind_local = (ecs_entity_t)name;
  name_local = (char *)e;
  e_local = (ecs_entity_t)world;
  if (world->magic != 0x65637377) {
    __assert_fail("world->magic == ECS_WORLD_MAGIC",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
                  ,0x364,
                  "ecs_entity_t ecs_new_trigger(ecs_world_t *, ecs_entity_t, const char *, ecs_entity_t, const char *, ecs_iter_action_t)"
                 );
  }
  result = ecs_lookup_path_w_sep(world,0,component_name,".",(char *)0x0);
  _ecs_assert(result != 0,3,(char *)action_local,"component != 0",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
              ,0x367);
  if (result == 0) {
    __assert_fail("component != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
                  ,0x367,
                  "ecs_entity_t ecs_new_trigger(ecs_world_t *, ecs_entity_t, const char *, ecs_entity_t, const char *, ecs_iter_action_t)"
                 );
  }
  eStack_48 = ecs_lookup_w_id((ecs_world_t *)e_local,(ecs_entity_t)name_local,(char *)kind_local);
  if (eStack_48 == 0) {
    eStack_48 = ecs_new_entity((ecs_world_t *)e_local,0,(char *)kind_local,(char *)0x0);
  }
  trigger._7_1_ = 0;
  plVar1 = (long *)ecs_get_mut_w_entity
                             ((ecs_world_t *)e_local,eStack_48,4,(_Bool *)((long)&trigger + 7));
  if ((trigger._7_1_ & 1) == 0) {
    if ((char *)*plVar1 != component_name_local) {
      _ecs_abort(0xe,(char *)kind_local,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
                 ,0x377);
      abort();
    }
    if (plVar1[2] != result) {
      _ecs_abort(0xe,(char *)kind_local,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
                 ,0x37b);
      abort();
    }
    if (plVar1[1] != component) {
      plVar1[1] = component;
    }
  }
  else {
    *plVar1 = (long)component_name_local;
    plVar1[1] = component;
    plVar1[2] = result;
    plVar1[4] = 0;
  }
  ecs_modified_w_entity((ecs_world_t *)e_local,eStack_48,4);
  return eStack_48;
}

Assistant:

ecs_entity_t ecs_new_trigger(
    ecs_world_t *world,
    ecs_entity_t e,
    const char *name,
    ecs_entity_t kind,
    const char *component_name,
    ecs_iter_action_t action)
{
    assert(world->magic == ECS_WORLD_MAGIC);

    ecs_entity_t component = ecs_lookup_fullpath(world, component_name);
    ecs_assert(component != 0, ECS_INVALID_COMPONENT_ID, component_name);

    ecs_entity_t result = ecs_lookup_w_id(world, e, name);
    if (!result) {
        result = ecs_new_entity(world, 0, name, NULL);
    }

    bool added = false;
    EcsTrigger *trigger = ecs_get_mut(world, result, EcsTrigger, &added);
    if (added) {
        trigger->kind = kind;
        trigger->action = action;
        trigger->component = component;
        trigger->ctx = NULL;
    } else {
        if (trigger->kind != kind) {
            ecs_abort(ECS_ALREADY_DEFINED, name);
        }

        if (trigger->component != component) {
            ecs_abort(ECS_ALREADY_DEFINED, name);
        }

        if (trigger->action != action) {
            trigger->action = action;
        }
    }
    
    ecs_modified(world, result, EcsTrigger);

    return result;
}